

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void XXH3_digest_long(XXH64_hash_t *acc,XXH3_state_t *state,uchar *secret)

{
  void *input;
  void *in_RSI;
  void *in_RDI;
  size_t catchupSize;
  xxh_u8 lastStripe [64];
  size_t nbStripesSoFar;
  size_t nbStripes;
  void *in_stack_ffffffffffffff88;
  code *secret_00;
  void *in_stack_ffffffffffffff90;
  xxh_u8 *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffa8;
  xxh_u64 *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  XXH3_f_accumulate_512 in_stack_ffffffffffffffc8;
  XXH3_f_scrambleAcc in_stack_ffffffffffffffd0;
  
  memcpy(in_RDI,in_RSI,0x40);
  if (*(uint *)((long)in_RSI + 0x200) < 0x40) {
    input = (void *)(ulong)(0x40 - *(int *)((long)in_RSI + 0x200));
    memcpy(&stack0xffffffffffffff98,(void *)((long)in_RSI + (0x200 - (long)input)),(size_t)input);
    memcpy(&stack0xffffffffffffff98 + (long)input,(void *)((long)in_RSI + 0x100),
           (ulong)*(uint *)((long)in_RSI + 0x200));
    XXH3_accumulate_512_sse2(in_stack_ffffffffffffff98,input,in_stack_ffffffffffffff88);
  }
  else {
    secret_00 = XXH3_scrambleAcc_sse2;
    XXH3_consumeStripes(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        (size_t)in_stack_ffffffffffffff90,(xxh_u8 *)XXH3_scrambleAcc_sse2,
                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffd0);
    XXH3_accumulate_512_sse2(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,secret_00);
  }
  return;
}

Assistant:

XXH_FORCE_INLINE void XXH3_digest_long(XXH64_hash_t* acc,
                                       const XXH3_state_t* state,
                                       const unsigned char* secret) {
  /*
   * Digest on a local copy. This way, the state remains unaltered, and it can
   * continue ingesting more input afterwards.
   */
  memcpy(acc, state->acc, sizeof(state->acc));
  if (state->bufferedSize >= XXH_STRIPE_LEN) {
    size_t const nbStripes = (state->bufferedSize - 1) / XXH_STRIPE_LEN;
    size_t nbStripesSoFar = state->nbStripesSoFar;
    XXH3_consumeStripes(acc, &nbStripesSoFar, state->nbStripesPerBlock,
                        state->buffer, nbStripes, secret, state->secretLimit,
                        XXH3_accumulate_512, XXH3_scrambleAcc);
    /* last stripe */
    XXH3_accumulate_512(acc,
                        state->buffer + state->bufferedSize - XXH_STRIPE_LEN,
                        secret + state->secretLimit - XXH_SECRET_LASTACC_START);
  } else { /* bufferedSize < XXH_STRIPE_LEN */
    xxh_u8 lastStripe[XXH_STRIPE_LEN];
    size_t const catchupSize = XXH_STRIPE_LEN - state->bufferedSize;
    XXH_ASSERT(state->bufferedSize >
               0); /* there is always some input buffered */
    memcpy(lastStripe, state->buffer + sizeof(state->buffer) - catchupSize,
           catchupSize);
    memcpy(lastStripe + catchupSize, state->buffer, state->bufferedSize);
    XXH3_accumulate_512(acc, lastStripe,
                        secret + state->secretLimit - XXH_SECRET_LASTACC_START);
  }
}